

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O0

SQInteger __thiscall SQLexer::ReadString(SQLexer *this,SQInteger ndelim,bool verbatim)

{
  int iVar1;
  ulong uVar2;
  SQUnsignedInteger SVar3;
  char *pcVar4;
  SQInteger len;
  char local_80 [8];
  char *local_78;
  SQChar *stemp_1;
  SQChar temp_1 [9];
  SQInteger maxdigits_1;
  char *local_50;
  SQChar *stemp;
  undefined8 uStack_40;
  SQChar temp [3];
  SQInteger maxdigits;
  ulong local_30;
  SQInteger x;
  ulong uStack_20;
  bool verbatim_local;
  SQInteger ndelim_local;
  SQLexer *this_local;
  
  x._6_1_ = 0;
  x._7_1_ = verbatim;
  uStack_20 = ndelim;
  ndelim_local = (SQInteger)this;
  sqvector<char>::resize(&this->_longstr,0,(char *)((long)&x + 6));
  Next(this);
  this->_currentcolumn = this->_currentcolumn + 1;
  if (this->_currdata == '\0') {
    this_local = (SQLexer *)0xffffffffffffffff;
  }
  else {
    while( true ) {
      while (this->_currdata != uStack_20) {
        local_30 = (ulong)this->_currdata;
        if (local_30 == 0) {
          Error(this,"unfinished string");
          return -1;
        }
        if (local_30 == 10) {
          if ((x._7_1_ & 1) == 0) {
            Error(this,"newline in a constant");
          }
          maxdigits._7_1_ = this->_currdata;
          sqvector<char>::push_back(&this->_longstr,(char *)((long)&maxdigits + 7));
          Next(this);
          this->_currentcolumn = this->_currentcolumn + 1;
          this->_currentline = this->_currentline + 1;
        }
        else if (local_30 == 0x5c) {
          if ((x._7_1_ & 1) == 0) {
            Next(this);
            this->_currentcolumn = this->_currentcolumn + 1;
            switch(this->_currdata) {
            case '\"':
              len._6_1_ = 0x22;
              sqvector<char>::push_back(&this->_longstr,(char *)((long)&len + 6));
              Next(this);
              this->_currentcolumn = this->_currentcolumn + 1;
              break;
            default:
              Error(this,"unrecognised escaper char");
              break;
            case '\'':
              len._5_1_ = 0x27;
              sqvector<char>::push_back(&this->_longstr,(char *)((long)&len + 5));
              Next(this);
              this->_currentcolumn = this->_currentcolumn + 1;
              break;
            case '0':
              local_80[0] = '\0';
              sqvector<char>::push_back(&this->_longstr,local_80);
              Next(this);
              this->_currentcolumn = this->_currentcolumn + 1;
              break;
            case 'U':
            case 'u':
              iVar1 = 8;
              if (local_30 == 0x75) {
                iVar1 = 4;
              }
              temp_1._1_8_ = SEXT48(iVar1);
              ProcessStringHexEscape(this,(SQChar *)((long)&stemp_1 + 7),temp_1._1_8_);
              uVar2 = strtoul((char *)((long)&stemp_1 + 7),&local_78,0x10);
              AddUTF8(this,uVar2);
              break;
            case '\\':
              len._7_1_ = 0x5c;
              sqvector<char>::push_back(&this->_longstr,(char *)((long)&len + 7));
              Next(this);
              this->_currentcolumn = this->_currentcolumn + 1;
              break;
            case 'a':
              local_80[6] = 7;
              sqvector<char>::push_back(&this->_longstr,local_80 + 6);
              Next(this);
              this->_currentcolumn = this->_currentcolumn + 1;
              break;
            case 'b':
              local_80[5] = 8;
              sqvector<char>::push_back(&this->_longstr,local_80 + 5);
              Next(this);
              this->_currentcolumn = this->_currentcolumn + 1;
              break;
            case 'f':
              local_80[1] = 0xc;
              sqvector<char>::push_back(&this->_longstr,local_80 + 1);
              Next(this);
              this->_currentcolumn = this->_currentcolumn + 1;
              break;
            case 'n':
              local_80[4] = 10;
              sqvector<char>::push_back(&this->_longstr,local_80 + 4);
              Next(this);
              this->_currentcolumn = this->_currentcolumn + 1;
              break;
            case 'r':
              local_80[3] = 0xd;
              sqvector<char>::push_back(&this->_longstr,local_80 + 3);
              Next(this);
              this->_currentcolumn = this->_currentcolumn + 1;
              break;
            case 't':
              local_80[7] = 9;
              sqvector<char>::push_back(&this->_longstr,local_80 + 7);
              Next(this);
              this->_currentcolumn = this->_currentcolumn + 1;
              break;
            case 'v':
              local_80[2] = 0xb;
              sqvector<char>::push_back(&this->_longstr,local_80 + 2);
              Next(this);
              this->_currentcolumn = this->_currentcolumn + 1;
              break;
            case 'x':
              uStack_40 = 2;
              ProcessStringHexEscape(this,(SQChar *)((long)&stemp + 5),2);
              uVar2 = strtoul((char *)((long)&stemp + 5),&local_50,0x10);
              maxdigits_1._7_1_ = (undefined1)uVar2;
              sqvector<char>::push_back(&this->_longstr,(char *)((long)&maxdigits_1 + 7));
            }
          }
          else {
            maxdigits._6_1_ = 0x5c;
            sqvector<char>::push_back(&this->_longstr,(char *)((long)&maxdigits + 6));
            Next(this);
            this->_currentcolumn = this->_currentcolumn + 1;
          }
        }
        else {
          len._4_1_ = this->_currdata;
          sqvector<char>::push_back(&this->_longstr,(char *)((long)&len + 4));
          Next(this);
          this->_currentcolumn = this->_currentcolumn + 1;
        }
      }
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      if (((x._7_1_ & 1) == 0) || (this->_currdata != '\"')) break;
      len._3_1_ = this->_currdata;
      sqvector<char>::push_back(&this->_longstr,(char *)((long)&len + 3));
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
    }
    len._2_1_ = 0;
    sqvector<char>::push_back(&this->_longstr,(char *)((long)&len + 2));
    SVar3 = sqvector<char>::size(&this->_longstr);
    if (uStack_20 == 0x27) {
      if (SVar3 == 1) {
        Error(this,"empty constant");
      }
      if (1 < (long)(SVar3 - 1)) {
        Error(this,"constant too long");
      }
      pcVar4 = sqvector<char>::operator[](&this->_longstr,0);
      this->_nvalue = (long)*pcVar4;
      this_local = (SQLexer *)0x104;
    }
    else {
      pcVar4 = sqvector<char>::operator[](&this->_longstr,0);
      this->_svalue = pcVar4;
      this_local = (SQLexer *)0x103;
    }
  }
  return (SQInteger)this_local;
}

Assistant:

SQInteger SQLexer::ReadString(SQInteger ndelim,bool verbatim)
{
    INIT_TEMP_STRING();
    NEXT();
    if(IS_EOB()) return -1;
    for(;;) {
        while(CUR_CHAR != ndelim) {
            SQInteger x = CUR_CHAR;
            switch (x) {
            case SQUIRREL_EOB:
                Error(_SC("unfinished string"));
                return -1;
            case _SC('\n'):
                if(!verbatim) Error(_SC("newline in a constant"));
                APPEND_CHAR(CUR_CHAR); NEXT();
                _currentline++;
                break;
            case _SC('\\'):
                if(verbatim) {
                    APPEND_CHAR('\\'); NEXT();
                }
                else {
                    NEXT();
                    switch(CUR_CHAR) {
                    case _SC('x'):  {
                        const SQInteger maxdigits = sizeof(SQChar) * 2;
                        SQChar temp[maxdigits + 1];
                        ProcessStringHexEscape(temp, maxdigits);
                        SQChar *stemp;
                        APPEND_CHAR((SQChar)scstrtoul(temp, &stemp, 16));
                    }
                    break;
                    case _SC('U'):
                    case _SC('u'):  {
                        const SQInteger maxdigits = x == 'u' ? 4 : 8;
                        SQChar temp[8 + 1];
                        ProcessStringHexEscape(temp, maxdigits);
                        SQChar *stemp;
#ifdef SQUNICODE
#if WCHAR_SIZE == 2
                        AddUTF16(scstrtoul(temp, &stemp, 16));
#else
                        APPEND_CHAR((SQChar)scstrtoul(temp, &stemp, 16));
#endif
#else
                        AddUTF8(scstrtoul(temp, &stemp, 16));
#endif
                    }
                    break;
                    case _SC('t'): APPEND_CHAR(_SC('\t')); NEXT(); break;
                    case _SC('a'): APPEND_CHAR(_SC('\a')); NEXT(); break;
                    case _SC('b'): APPEND_CHAR(_SC('\b')); NEXT(); break;
                    case _SC('n'): APPEND_CHAR(_SC('\n')); NEXT(); break;
                    case _SC('r'): APPEND_CHAR(_SC('\r')); NEXT(); break;
                    case _SC('v'): APPEND_CHAR(_SC('\v')); NEXT(); break;
                    case _SC('f'): APPEND_CHAR(_SC('\f')); NEXT(); break;
                    case _SC('0'): APPEND_CHAR(_SC('\0')); NEXT(); break;
                    case _SC('\\'): APPEND_CHAR(_SC('\\')); NEXT(); break;
                    case _SC('"'): APPEND_CHAR(_SC('"')); NEXT(); break;
                    case _SC('\''): APPEND_CHAR(_SC('\'')); NEXT(); break;
                    default:
                        Error(_SC("unrecognised escaper char"));
                    break;
                    }
                }
                break;
            default:
                APPEND_CHAR(CUR_CHAR);
                NEXT();
            }
        }
        NEXT();
        if(verbatim && CUR_CHAR == '"') { //double quotation
            APPEND_CHAR(CUR_CHAR);
            NEXT();
        }
        else {
            break;
        }
    }
    TERMINATE_BUFFER();
    SQInteger len = _longstr.size()-1;
    if(ndelim == _SC('\'')) {
        if(len == 0) Error(_SC("empty constant"));
        if(len > 1) Error(_SC("constant too long"));
        _nvalue = _longstr[0];
        return TK_INTEGER;
    }
    _svalue = &_longstr[0];
    return TK_STRING_LITERAL;
}